

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall bsplib::exception::exception(exception *this,exception *e)

{
  string local_30 [32];
  
  *(undefined ***)this = &PTR__exception_0011bd20;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream,local_30,_S_out);
  std::__cxx11::string::~string(local_30);
  (this->m_buf)._M_dataplus._M_p = (pointer)&(this->m_buf).field_2;
  (this->m_buf)._M_string_length = 0;
  (this->m_buf).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

exception( const exception & e )
      : m_stream( e.m_stream.str() )
      , m_buf( )
    {}